

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint checkColorValidity(LodePNGColorType colortype,uint bd)

{
  uint bd_local;
  LodePNGColorType colortype_local;
  
  if (colortype == LCT_GREY) {
    if ((((bd != 1) && (bd != 2)) && (bd != 4)) && ((bd != 8 && (bd != 0x10)))) {
      return 0x25;
    }
  }
  else if (colortype == LCT_RGB) {
    if ((bd != 8) && (bd != 0x10)) {
      return 0x25;
    }
  }
  else if (colortype == LCT_PALETTE) {
    if ((((bd != 1) && (bd != 2)) && (bd != 4)) && (bd != 8)) {
      return 0x25;
    }
  }
  else if (colortype == LCT_GREY_ALPHA) {
    if ((bd != 8) && (bd != 0x10)) {
      return 0x25;
    }
  }
  else {
    if (colortype != LCT_RGBA) {
      if (colortype != LCT_MAX_OCTET_VALUE) {
        return 0x1f;
      }
      return 0x1f;
    }
    if ((bd != 8) && (bd != 0x10)) {
      return 0x25;
    }
  }
  return 0;
}

Assistant:

static unsigned checkColorValidity(LodePNGColorType colortype, unsigned bd) {
  switch(colortype) {
    case LCT_GREY:       if(!(bd == 1 || bd == 2 || bd == 4 || bd == 8 || bd == 16)) return 37; break;
    case LCT_RGB:        if(!(                                 bd == 8 || bd == 16)) return 37; break;
    case LCT_PALETTE:    if(!(bd == 1 || bd == 2 || bd == 4 || bd == 8            )) return 37; break;
    case LCT_GREY_ALPHA: if(!(                                 bd == 8 || bd == 16)) return 37; break;
    case LCT_RGBA:       if(!(                                 bd == 8 || bd == 16)) return 37; break;
    case LCT_MAX_OCTET_VALUE: return 31; /* invalid color type */
    default: return 31; /* invalid color type */
  }
  return 0; /*allowed color type / bits combination*/
}